

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O2

uint LiteScript::AddCallback
               (_func_Variable_State_ptr_vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_ptr
                *value)

{
  value_type local_10;
  
  std::
  vector<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&),_std::allocator<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&)>_>
  ::push_back(&Callback::List,&local_10);
  return (int)((ulong)((long)Callback::List.
                             super__Vector_base<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&),_std::allocator<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&)>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)Callback::List.
                            super__Vector_base<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&),_std::allocator<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&)>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1;
}

Assistant:

unsigned int LiteScript::AddCallback(Variable (*value)(State &, std::vector<Variable> &)) {
    Callback::List.push_back(value);
    return Callback::List.size() - 1;
}